

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void sha256_final(sha256_t *p,uchar *digest)

{
  uint64_t uVar1;
  uint uVar2;
  long lVar3;
  uchar uVar4;
  long lVar5;
  
  uVar1 = p->count;
  uVar2 = (uint)uVar1 & 0x3f;
  uVar4 = 0x80;
  while( true ) {
    p->buffer[uVar2] = uVar4;
    if (uVar2 + 1 == 0x38) break;
    uVar2 = uVar2 + 1 & 0x3f;
    if (uVar2 == 0) {
      sha256_write_byte_block(p);
    }
    uVar4 = '\0';
  }
  lVar5 = uVar1 << 3;
  for (lVar3 = 0x60; lVar3 != 0x68; lVar3 = lVar3 + 1) {
    *(char *)((long)p->state + lVar3) = (char)((ulong)lVar5 >> 0x38);
    lVar5 = lVar5 << 8;
  }
  sha256_write_byte_block(p);
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    digest[lVar3 * 4] = *(uchar *)((long)p->state + lVar3 * 4 + 3);
    digest[lVar3 * 4 + 1] = *(uchar *)((long)p->state + lVar3 * 4 + 2);
    digest[lVar3 * 4 + 2] = *(uchar *)((long)p->state + lVar3 * 4 + 1);
    digest[lVar3 * 4 + 3] = (uchar)p->state[lVar3];
  }
  sha256_init(p);
  return;
}

Assistant:

void
sha256_final(sha256_t *p, unsigned char *digest)
{
  uint64_t lenInBits = (p->count << 3);
  uint32_t curBufferPos = (uint32_t)p->count & 0x3F;
  unsigned i;
  p->buffer[curBufferPos++] = 0x80;
  while (curBufferPos != (64 - 8))
  {
    curBufferPos &= 0x3F;
    if (curBufferPos == 0)
      sha256_write_byte_block(p);
    p->buffer[curBufferPos++] = 0;
  }
  for (i = 0; i < 8; i++)
  {
    p->buffer[curBufferPos++] = (unsigned char)(lenInBits >> 56);
    lenInBits <<= 8;
  }
  sha256_write_byte_block(p);

  for (i = 0; i < 8; i++)
  {
    *digest++ = (unsigned char)(p->state[i] >> 24);
    *digest++ = (unsigned char)(p->state[i] >> 16);
    *digest++ = (unsigned char)(p->state[i] >> 8);
    *digest++ = (unsigned char)(p->state[i]);
  }
  sha256_init(p);
}